

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_iris.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Dataset *d)

{
  pointer pvVar1;
  float *__dest;
  pointer pvVar2;
  ulong __n;
  valarray<float> v;
  Array local_40;
  
  pvVar1 = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pvVar2 = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar2 != pvVar1; pvVar2 = pvVar2 + 1) {
    local_40._M_size = pvVar2->_M_size;
    __n = local_40._M_size << 2;
    __dest = (float *)operator_new(__n);
    local_40._M_data = __dest;
    if (pvVar2->_M_data != (float *)0x0) {
      memcpy(__dest,pvVar2->_M_data,__n);
    }
    notch::io::operator<<(out,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
    operator_delete(__dest);
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Dataset &d) {
    for (auto v : d) {
        out << v << "\n";
    }
    return out;
}